

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O0

bool __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::operator==(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
             *this,GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                   *rhs)

{
  bool bVar1;
  int iVar2;
  ulong local_28;
  size_t i;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *rhs_local;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_local;
  
  bVar1 = IsValid(this);
  if (((bVar1) && (bVar1 = IsValid(rhs), bVar1)) && (this->tokenCount_ == rhs->tokenCount_)) {
    for (local_28 = 0; local_28 < this->tokenCount_; local_28 = local_28 + 1) {
      if (((this->tokens_[local_28].index != rhs->tokens_[local_28].index) ||
          (this->tokens_[local_28].length != rhs->tokens_[local_28].length)) ||
         ((this->tokens_[local_28].length != 0 &&
          (iVar2 = memcmp(this->tokens_[local_28].name,rhs->tokens_[local_28].name,
                          (ulong)this->tokens_[local_28].length), iVar2 != 0)))) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const GenericPointer& rhs) const {
        if (!IsValid() || !rhs.IsValid() || tokenCount_ != rhs.tokenCount_)
            return false;

        for (size_t i = 0; i < tokenCount_; i++) {
            if (tokens_[i].index != rhs.tokens_[i].index ||
                tokens_[i].length != rhs.tokens_[i].length || 
                (tokens_[i].length != 0 && std::memcmp(tokens_[i].name, rhs.tokens_[i].name, sizeof(Ch)* tokens_[i].length) != 0))
            {
                return false;
            }
        }

        return true;
    }